

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

acCode readAC(FILE *f,uchar number)

{
  acCode aVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_28;
  int iStack_24;
  uchar b;
  int i;
  int code;
  uchar first;
  uchar codeLen;
  uchar zeros;
  uchar x;
  uchar number_local;
  FILE *f_local;
  
  bVar2 = matchHuff(f,number,'\x01');
  f_local._1_1_ = (undefined1)((int)(uint)bVar2 >> 4);
  f_local._0_1_ = bVar2 & 0xf;
  if (bVar2 == 0) {
    f_local._0_1_ = 0;
    f_local._1_1_ = 0;
    f_local._4_4_ = 0;
  }
  else if (bVar2 == 0xf0) {
    f_local._0_1_ = 0;
    f_local._1_1_ = 0x10;
    f_local._4_4_ = 0;
  }
  else {
    bVar3 = getBit(f);
    iStack_24 = 1;
    for (local_28 = 1; local_28 < (int)(uint)(byte)f_local; local_28 = local_28 + 1) {
      bVar4 = getBit(f);
      if (!bVar3) {
        bVar4 = (bool)((bVar4 ^ 0xffU) & 1);
      }
      local_30 = (uint)bVar4;
      iStack_24 = local_30 + iStack_24 * 2;
    }
    if (bVar3) {
      local_34 = iStack_24;
    }
    else {
      local_34 = -iStack_24;
    }
    f_local._4_4_ = local_34;
  }
  aVar1.zeros = f_local._1_1_;
  aVar1.len = (byte)f_local;
  aVar1._2_2_ = f_local._2_2_;
  aVar1.value = f_local._4_4_;
  return aVar1;
}

Assistant:

acCode readAC(FILE *f, unsigned char number) {
    unsigned char x = matchHuff(f, number, AC);
    unsigned char zeros = x >> 4;
    unsigned char codeLen = x & 0x0F;
    if (x == 0) {
        return acCode{0,0,0};
    } else if (x == 0xF0) {
        return acCode{0, 16, 0};
    }
    unsigned  char first = getBit(f);
    int code = 1;
    for (int i = 1; i < codeLen; i++) {
        unsigned char b = getBit(f);
        code = code << 1;
        code += first ? b : !b;
    }
    code = first ? code : -code;
//    printf("read AC: %d %d %d\n", codeLen, zeros, code);
    return acCode{codeLen, zeros, code};
}